

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O2

int anon_unknown.dwarf_7353::RtMidi_getportname(lua_State *L)

{
  int iVar1;
  RtMidi *pRVar2;
  string name;
  
  pRVar2 = getRtMidi(L,1);
  iVar1 = luaL_optinteger(L,2,1);
  (*pRVar2->_vptr_RtMidi[3])(&name,pRVar2,(ulong)(iVar1 - 1));
  lua_pushlstring(L,name._M_dataplus._M_p,name._M_string_length);
  std::__cxx11::string::~string((string *)&name);
  return 1;
}

Assistant:

int RtMidi_getportname(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	auto name = self.getPortName(static_cast<unsigned>(luaL_optinteger(L, 2, 1)) - 1);
	lua_pushlstring(L, name.c_str(), name.size());
	return 1;
}